

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O0

set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
* getEigenSpaceBasis(set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                     *__return_storage_ptr__,RationalNum **matrix,uint size,RationalNum eigenValue)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  RationalNum **matrix_00;
  ulong uVar5;
  RationalNum *pRVar6;
  RationalNum **ppRVar7;
  reference pvVar8;
  long lVar9;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar10;
  RationalNum RVar11;
  bool local_229;
  RationalNum *local_1c8;
  uint local_194;
  int i_4;
  RationalNum local_180;
  RationalNum local_170;
  RationalNum local_160;
  _Self local_150;
  uint local_144;
  _Self local_140;
  uint local_134;
  undefined1 local_130 [4];
  int j_3;
  uint local_11c;
  uint local_118;
  int j_2;
  int cur;
  int i_3;
  allocator<RationalNum> local_f9;
  undefined1 local_f8 [8];
  vector<RationalNum,_std::allocator<RationalNum>_> basisVector;
  _Self local_d8;
  key_type_conflict local_cc;
  _Rb_tree_const_iterator<unsigned_int> _Stack_c8;
  uint k;
  undefined1 local_c0;
  uint local_b4;
  RationalNum local_b0;
  uint local_a0;
  uint local_9c;
  int j_1;
  int i_2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> basisFields;
  RationalNum **gaussForm;
  uint local_50;
  int i_1;
  int j;
  uint local_3c;
  int i;
  RationalNum **editedMatrix;
  uint size_local;
  RationalNum **matrix_local;
  RationalNum eigenValue_local;
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  *basis;
  
  eigenValue_local.numerator = eigenValue.denominator;
  matrix_local = (RationalNum **)eigenValue.numerator;
  uVar4 = SUB168(ZEXT416(size) * ZEXT816(8),0);
  if (SUB168(ZEXT416(size) * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  eigenValue_local.denominator = (longlong)__return_storage_ptr__;
  matrix_00 = (RationalNum **)operator_new__(uVar4);
  for (local_3c = 0; local_3c < size; local_3c = local_3c + 1) {
    uVar4 = CONCAT44(0,size);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pRVar6 = (RationalNum *)operator_new__(uVar5);
    if (uVar4 != 0) {
      local_1c8 = pRVar6;
      do {
        RationalNum::RationalNum(local_1c8);
        local_1c8 = local_1c8 + 1;
      } while (local_1c8 != pRVar6 + uVar4);
    }
    matrix_00[(int)local_3c] = pRVar6;
    for (local_50 = 0; local_50 < size; local_50 = local_50 + 1) {
      RationalNum::operator=
                (matrix_00[(int)local_3c] + (int)local_50,matrix[(int)local_3c] + (int)local_50);
    }
  }
  for (gaussForm._4_4_ = 0; gaussForm._4_4_ < size; gaussForm._4_4_ = gaussForm._4_4_ + 1) {
    RationalNum::operator-=
              (matrix_00[(int)gaussForm._4_4_] + (int)gaussForm._4_4_,(RationalNum *)&matrix_local);
  }
  ppRVar7 = getGaussForm(matrix_00,size);
  basisFields._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  ::set(__return_storage_ptr__);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&j_1);
  local_9c = 0;
  do {
    if (size <= local_9c) {
      local_cc = 0;
      do {
        if (size <= local_cc) {
          for (local_194 = 0; local_194 < size; local_194 = local_194 + 1) {
            if (ppRVar7[(int)local_194] != (RationalNum *)0x0) {
              operator_delete__(ppRVar7[(int)local_194]);
            }
            if (matrix_00[(int)local_194] != (RationalNum *)0x0) {
              operator_delete__(matrix_00[(int)local_194]);
            }
          }
          if (ppRVar7 != (RationalNum **)0x0) {
            operator_delete__(ppRVar7);
          }
          if (matrix_00 != (RationalNum **)0x0) {
            operator_delete__(matrix_00);
          }
          basisFields._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &j_1);
          if ((basisFields._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
            std::
            set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
            ::~set(__return_storage_ptr__);
          }
          return __return_storage_ptr__;
        }
        local_d8._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&j_1,&local_cc);
        basisVector.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&j_1);
        bVar3 = std::operator!=(&local_d8,
                                (_Self *)&basisVector.
                                          super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar3) {
          std::allocator<RationalNum>::allocator(&local_f9);
          std::vector<RationalNum,_std::allocator<RationalNum>_>::vector
                    ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_f8,(ulong)size,
                     &local_f9);
          std::allocator<RationalNum>::~allocator(&local_f9);
          RationalNum::RationalNum((RationalNum *)&cur,1,1);
          pvVar8 = std::vector<RationalNum,_std::allocator<RationalNum>_>::operator[]
                             ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_f8,
                              (ulong)local_cc);
          RationalNum::operator=(pvVar8,(RationalNum *)&cur);
          for (j_2 = 0; (uint)j_2 < size; j_2 = j_2 + 1) {
            local_118 = size;
            for (local_11c = 0; local_11c < size; local_11c = local_11c + 1) {
              pRVar6 = ppRVar7[~j_2 + size];
              lVar9 = (long)(int)local_11c;
              RationalNum::RationalNum((RationalNum *)local_130,0,1);
              bVar3 = operator!=(pRVar6 + lVar9,(RationalNum *)local_130);
              if (bVar3) {
                local_118 = local_11c;
                break;
              }
            }
            uVar2 = local_118;
            if (local_118 != size) {
              while (local_134 = uVar2 + 1, local_134 < size) {
                local_144 = local_134;
                local_140._M_node =
                     (_Base_ptr)
                     std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::find((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&j_1,&local_144);
                local_150._M_node =
                     (_Base_ptr)
                     std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&j_1);
                local_229 = std::operator!=(&local_140,&local_150);
                local_229 = local_229 || local_134 == local_cc;
                uVar2 = local_134;
                if (local_229) {
                  pvVar8 = std::vector<RationalNum,_std::allocator<RationalNum>_>::operator[]
                                     ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_f8,
                                      (long)(int)local_134);
                  RVar11 = operator*(pvVar8,ppRVar7[~j_2 + size] + (int)local_134);
                  local_160 = RVar11;
                  pvVar8 = std::vector<RationalNum,_std::allocator<RationalNum>_>::operator[]
                                     ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_f8,
                                      (long)(int)local_118);
                  RationalNum::operator+=(pvVar8,&local_160);
                  uVar2 = local_134;
                }
              }
              pvVar8 = std::vector<RationalNum,_std::allocator<RationalNum>_>::operator[]
                                 ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_f8,
                                  (long)(int)local_118);
              RVar11 = RationalNum::operator-(pvVar8);
              local_180 = RVar11;
              RVar11 = operator/(&local_180,ppRVar7[~j_2 + size] + (int)local_118);
              local_170 = RVar11;
              pvVar8 = std::vector<RationalNum,_std::allocator<RationalNum>_>::operator[]
                                 ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_f8,
                                  (long)(int)local_118);
              RationalNum::operator=(pvVar8,&local_170);
            }
          }
          std::
          set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
          ::insert(__return_storage_ptr__,(value_type *)local_f8);
          std::vector<RationalNum,_std::allocator<RationalNum>_>::~vector
                    ((vector<RationalNum,_std::allocator<RationalNum>_> *)local_f8);
        }
        local_cc = local_cc + 1;
      } while( true );
    }
    for (local_a0 = 0; local_a0 < size; local_a0 = local_a0 + 1) {
      pRVar6 = ppRVar7[(int)local_9c];
      lVar9 = (long)(int)local_a0;
      RationalNum::RationalNum(&local_b0,0,1);
      bVar3 = operator!=(pRVar6 + lVar9,&local_b0);
      if (bVar3) {
        local_b4 = local_a0;
        pVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&j_1,&local_b4);
        _Stack_c8 = pVar10.first._M_node;
        local_c0 = pVar10.second;
        break;
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

set<vector<RationalNum>> getEigenSpaceBasis(RationalNum** matrix, unsigned int size, RationalNum eigenValue) {
    RationalNum** editedMatrix = new RationalNum* [size];
    for(int i = 0; i < size; i++) {
        editedMatrix[i] = new RationalNum [size];
        for(int j = 0; j < size; j++) editedMatrix[i][j] = matrix[i][j];
    }
    for(int i = 0; i < size; i++) editedMatrix[i][i] -= eigenValue;

    RationalNum** gaussForm = getGaussForm(editedMatrix, size);
    set<vector<RationalNum>> basis;

    set<unsigned int> basisFields;
    for(int i = 0; i < size; i++) {
        for(int j = 0; j < size; j++) {
            if(gaussForm[i][j] != 0ll) {
                basisFields.insert(j);
                break;
            }
        }
    }
    for(unsigned int k = 0; k < size; k++) {
        if(basisFields.find(k) != basisFields.end()) continue;
        vector<RationalNum> basisVector(size);
        basisVector[k] = 1ll;
        for(int i = 0; i < size; i++) {
            int cur = size;
            for(int j = 0; j < size; j++) {
                if(gaussForm[size - i - 1][j] != 0ll) {
                    cur = j;
                    break;
                }
            }
            if(cur == size) continue;
            for(int j = cur + 1; j < size; j++) {
                if(basisFields.find(j) != basisFields.end() || j == k) basisVector[cur] += basisVector[j] * gaussForm[size - i - 1][j];
            }
            basisVector[cur] = -basisVector[cur] / gaussForm[size - i - 1][cur];
        }
        basis.insert(basisVector);
    }

    for(int i = 0; i < size; i++) {
        delete[] gaussForm[i];
        delete[] editedMatrix[i];
    }
    delete[] gaussForm;
    delete[] editedMatrix;

    return basis;
}